

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::AssertionInfo::~AssertionInfo(AssertionInfo *this)

{
  std::__cxx11::string::~string((string *)&this->capturedExpression);
  std::__cxx11::string::~string((string *)&this->lineInfo);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

AssertionInfo() {}